

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O0

void __thiscall happly::TypedProperty<short>::~TypedProperty(TypedProperty<short> *this)

{
  TypedProperty<short> *in_RDI;
  
  ~TypedProperty(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~TypedProperty() override{}